

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regiongraph.cpp
# Opt level: O1

void __thiscall libDAI::RegionGraph::RecomputeOR(RegionGraph *this,size_t I)

{
  _Rb_tree_header *p_Var1;
  ulong *puVar2;
  pointer pFVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  ulong uVar12;
  _Base_ptr p_Var13;
  mapped_type_conflict *pmVar14;
  _Rb_tree_node_base *p_Var15;
  _Base_ptr p_Var16;
  long lVar17;
  ulong uVar18;
  _Self __tmp;
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  size_t local_30;
  
  p_Var1 = &(this->_fac2OR)._M_t._M_impl.super__Rb_tree_header;
  p_Var16 = (this->_fac2OR)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var13 = &p_Var1->_M_header;
  for (; p_Var16 != (_Base_ptr)0x0; p_Var16 = (&p_Var16->_M_left)[*(ulong *)(p_Var16 + 1) < I]) {
    if (*(ulong *)(p_Var16 + 1) >= I) {
      p_Var13 = p_Var16;
    }
  }
  p_Var16 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var13 != p_Var1) && (p_Var16 = p_Var13, I < *(ulong *)(p_Var13 + 1))) {
    p_Var16 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var16 != p_Var1) {
    local_30 = I;
    pmVar14 = std::
              map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
              ::operator[](&this->_fac2OR,&local_30);
    p_Var16 = (_Base_ptr)*pmVar14;
    pFVar3 = (this->_rg)._V1.super__Vector_base<libDAI::FRegion,_std::allocator<libDAI::FRegion>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar4 = *(long *)&pFVar3[(long)p_Var16].super_Factor._p._p;
    lVar17 = (long)*(pointer *)((long)&pFVar3[(long)p_Var16].super_Factor._p + 8) - lVar4;
    if (lVar17 != 0) {
      lVar17 = lVar17 >> 3;
      auVar19 = vpbroadcastq_avx512f();
      uVar18 = 0;
      auVar20 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar21 = vbroadcastsd_avx512f(ZEXT816(0x3ff0000000000000));
      do {
        auVar22 = vpbroadcastq_avx512f();
        auVar22 = vporq_avx512f(auVar22,auVar20);
        uVar12 = vpcmpuq_avx512f(auVar22,auVar19,2);
        puVar2 = (ulong *)(lVar4 + uVar18 * 8);
        bVar5 = (bool)((byte)uVar12 & 1);
        bVar6 = (bool)((byte)(uVar12 >> 1) & 1);
        bVar7 = (bool)((byte)(uVar12 >> 2) & 1);
        bVar8 = (bool)((byte)(uVar12 >> 3) & 1);
        bVar9 = (bool)((byte)(uVar12 >> 4) & 1);
        bVar10 = (bool)((byte)(uVar12 >> 5) & 1);
        bVar11 = (bool)((byte)(uVar12 >> 6) & 1);
        *puVar2 = (ulong)bVar5 * auVar21._0_8_ | (ulong)!bVar5 * *puVar2;
        puVar2[1] = (ulong)bVar6 * auVar21._8_8_ | (ulong)!bVar6 * puVar2[1];
        puVar2[2] = (ulong)bVar7 * auVar21._16_8_ | (ulong)!bVar7 * puVar2[2];
        puVar2[3] = (ulong)bVar8 * auVar21._24_8_ | (ulong)!bVar8 * puVar2[3];
        puVar2[4] = (ulong)bVar9 * auVar21._32_8_ | (ulong)!bVar9 * puVar2[4];
        puVar2[5] = (ulong)bVar10 * auVar21._40_8_ | (ulong)!bVar10 * puVar2[5];
        puVar2[6] = (ulong)bVar11 * auVar21._48_8_ | (ulong)!bVar11 * puVar2[6];
        puVar2[7] = (uVar12 >> 7) * auVar21._56_8_ | (ulong)!SUB81(uVar12 >> 7,0) * puVar2[7];
        uVar18 = uVar18 + 8;
      } while ((lVar17 + (ulong)(lVar17 == 0) + 7 & 0xfffffffffffffff8) != uVar18);
    }
    for (p_Var15 = (this->_fac2OR)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var15 != p_Var1;
        p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15)) {
      if (p_Var15[1]._M_parent == p_Var16) {
        TFactor<double>::operator*=
                  (&(this->_rg)._V1.
                    super__Vector_base<libDAI::FRegion,_std::allocator<libDAI::FRegion>_>._M_impl.
                    super__Vector_impl_data._M_start[(long)p_Var16].super_Factor,
                   (this->_fg)._fg._V2.
                   super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + *(long *)(p_Var15 + 1));
      }
    }
  }
  return;
}

Assistant:

void RegionGraph::RecomputeOR( size_t I ) {
        if( _fac2OR.count(I) ) {
            size_t alpha = _fac2OR[I];
            OR(alpha).fill( 1.0 );
            for( fac2OR_cit I = _fac2OR.begin(); I != _fac2OR.end(); I++ )
                if( I->second == alpha )
                    OR(alpha) *= _fg.factor( I->first );
        }
    }